

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict
sexp_file_access_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  undefined8 uVar3;
  
  if ((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) {
    if ((((ulong)arg1 & 1) != 0) || ((((ulong)arg1 & 2) == 0 && (arg1->tag == 0xc)))) {
      if (((ulong)arg1 & 1) == 0) {
        if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
          iVar1 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
        }
        else {
          iVar1 = 0;
        }
      }
      else {
        iVar1 = (int)((long)arg1 >> 1);
      }
      iVar1 = access((((arg0->value).type.cpl)->value).flonum_bits +
                     (long)(((arg0->value).type.name)->value).flonum_bits,iVar1);
      psVar2 = (sexp_conflict)sexp_make_integer(ctx,(long)iVar1,(long)(iVar1 >> 0x1f));
      return psVar2;
    }
    uVar3 = 2;
  }
  else {
    uVar3 = 9;
    arg1 = arg0;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,uVar3,arg1);
  return psVar2;
}

Assistant:

sexp sexp_file_access_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_integer(ctx, access(sexp_string_data(arg0), sexp_sint_value(arg1)));
  return res;
}